

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::Open(Benchmark *this)

{
  FILE *__stream;
  int iVar1;
  Env *pEVar2;
  undefined8 uVar3;
  long lVar4;
  char *err_msg;
  string create_stmt;
  string locking_stmt;
  Status local_190;
  string tmp_dir;
  string stmt_array [2];
  char cache_size [100];
  char file_name [100];
  
  if (this->db_ != (sqlite3 *)0x0) {
    __assert_fail("db_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/benchmarks/db_bench_sqlite3.cc"
                  ,0x1a6,"void leveldb::Benchmark::Open()");
  }
  err_msg = (char *)0x0;
  this->db_num_ = this->db_num_ + 1;
  tmp_dir._M_dataplus._M_p = (pointer)&tmp_dir.field_2;
  tmp_dir._M_string_length = 0;
  tmp_dir.field_2._M_local_buf[0] = '\0';
  pEVar2 = Env::Default();
  (*pEVar2->_vptr_Env[0x13])(&local_190,pEVar2,&tmp_dir);
  Status::~Status(&local_190);
  snprintf(file_name,100,"%s/dbbench_sqlite3-%d.db",tmp_dir._M_dataplus._M_p,
           (ulong)(uint)this->db_num_);
  iVar1 = sqlite3_open(file_name,this);
  __stream = _stderr;
  if (iVar1 == 0) {
    snprintf(cache_size,100,"PRAGMA cache_size = %d",(ulong)(uint)FLAGS_num_pages);
    iVar1 = sqlite3_exec(this->db_,cache_size,0,0,&err_msg);
    ExecErrorCheck(iVar1,err_msg);
    if (FLAGS_page_size != 0x400) {
      snprintf((char *)stmt_array,100,"PRAGMA page_size = %d");
      iVar1 = sqlite3_exec(this->db_,stmt_array,0,0,&err_msg);
      ExecErrorCheck(iVar1,err_msg);
    }
    if (FLAGS_WAL_enabled == true) {
      std::__cxx11::string::string
                ((string *)stmt_array,"PRAGMA journal_mode = WAL",(allocator *)&locking_stmt);
      std::__cxx11::string::string
                ((string *)&locking_stmt,"PRAGMA wal_autocheckpoint = 4096",
                 (allocator *)&create_stmt);
      iVar1 = sqlite3_exec(this->db_,stmt_array[0]._M_dataplus._M_p,0,0,&err_msg);
      ExecErrorCheck(iVar1,err_msg);
      iVar1 = sqlite3_exec(this->db_,locking_stmt._M_dataplus._M_p,0,0,&err_msg);
      ExecErrorCheck(iVar1,err_msg);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::string
              ((string *)&locking_stmt,"PRAGMA locking_mode = EXCLUSIVE",(allocator *)stmt_array);
    std::__cxx11::string::string
              ((string *)&create_stmt,"CREATE TABLE test (key blob, value blob, PRIMARY KEY(key))",
               (allocator *)stmt_array);
    if (FLAGS_use_rowids == false) {
      std::__cxx11::string::append((char *)&create_stmt);
    }
    std::__cxx11::string::string((string *)stmt_array,(string *)&locking_stmt);
    std::__cxx11::string::string((string *)(stmt_array + 1),(string *)&create_stmt);
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x20) {
      iVar1 = sqlite3_exec(this->db_,*(undefined8 *)((long)&stmt_array[0]._M_dataplus._M_p + lVar4),
                           0,0,&err_msg);
      ExecErrorCheck(iVar1,err_msg);
    }
    lVar4 = 0x20;
    do {
      std::__cxx11::string::_M_dispose();
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return;
  }
  uVar3 = sqlite3_errmsg(this->db_);
  fprintf(__stream,"open error: %s\n",uVar3);
  exit(1);
}

Assistant:

void Open() {
    assert(db_ == nullptr);

    int status;
    char file_name[100];
    char* err_msg = nullptr;
    db_num_++;

    // Open database
    std::string tmp_dir;
    Env::Default()->GetTestDirectory(&tmp_dir);
    std::snprintf(file_name, sizeof(file_name), "%s/dbbench_sqlite3-%d.db",
                  tmp_dir.c_str(), db_num_);
    status = sqlite3_open(file_name, &db_);
    if (status) {
      std::fprintf(stderr, "open error: %s\n", sqlite3_errmsg(db_));
      std::exit(1);
    }

    // Change SQLite cache size
    char cache_size[100];
    std::snprintf(cache_size, sizeof(cache_size), "PRAGMA cache_size = %d",
                  FLAGS_num_pages);
    status = sqlite3_exec(db_, cache_size, nullptr, nullptr, &err_msg);
    ExecErrorCheck(status, err_msg);

    // FLAGS_page_size is defaulted to 1024
    if (FLAGS_page_size != 1024) {
      char page_size[100];
      std::snprintf(page_size, sizeof(page_size), "PRAGMA page_size = %d",
                    FLAGS_page_size);
      status = sqlite3_exec(db_, page_size, nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
    }

    // Change journal mode to WAL if WAL enabled flag is on
    if (FLAGS_WAL_enabled) {
      std::string WAL_stmt = "PRAGMA journal_mode = WAL";

      // LevelDB's default cache size is a combined 4 MB
      std::string WAL_checkpoint = "PRAGMA wal_autocheckpoint = 4096";
      status = sqlite3_exec(db_, WAL_stmt.c_str(), nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
      status =
          sqlite3_exec(db_, WAL_checkpoint.c_str(), nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
    }

    // Change locking mode to exclusive and create tables/index for database
    std::string locking_stmt = "PRAGMA locking_mode = EXCLUSIVE";
    std::string create_stmt =
        "CREATE TABLE test (key blob, value blob, PRIMARY KEY(key))";
    if (!FLAGS_use_rowids) create_stmt += " WITHOUT ROWID";
    std::string stmt_array[] = {locking_stmt, create_stmt};
    int stmt_array_length = sizeof(stmt_array) / sizeof(std::string);
    for (int i = 0; i < stmt_array_length; i++) {
      status =
          sqlite3_exec(db_, stmt_array[i].c_str(), nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
    }
  }